

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  u8 i;
  long lVar1;
  double dVar2;
  Simd<double,_(unsigned_char)__x02_> SVar3;
  SR result;
  Simd<double,_(unsigned_char)__x02_> lhs;
  Simd<double,_(unsigned_char)__x02_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  double local_38 [2];
  double local_28 [2];
  
  local_28 = (double  [2])Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  SVar3 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    dVar2 = (*f)(local_38[lVar1],local_28[lVar1]);
    *(double *)((long)&local_48 + lVar1 * 8) = dVar2;
  }
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}